

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strong_typedef.cpp
# Opt level: O0

int main(void)

{
  addition<distance> *rhs;
  initializer_list<distance> __l;
  reference d_00;
  ostream *poVar1;
  _Node_iterator_base<distance,_false> local_80 [3];
  allocator<distance> local_67;
  key_equal local_66;
  hasher local_65;
  distance local_64;
  iterator local_60;
  size_type local_58;
  undefined1 local_50 [8];
  unordered_set<distance,_std::hash<distance>,_std::equal_to<distance>,_std::allocator<distance>_>
  set;
  uint local_10;
  key_type local_c [2];
  distance d;
  
  local_10 = 4;
  distance::strong_typedef((distance *)local_c,&local_10);
  set._M_h._M_single_bucket._0_4_ = 3;
  rhs = (addition<distance> *)((long)&set._M_h._M_single_bucket + 4);
  distance::strong_typedef((distance *)rhs,(uint *)&set._M_h._M_single_bucket);
  type_safe::strong_typedef_op::operator+=((addition<distance> *)local_c,rhs);
  local_64.super_strong_typedef<distance,_unsigned_int>.value_ =
       local_c[0].super_strong_typedef<distance,_unsigned_int>.value_;
  local_60 = &local_64;
  local_58 = 1;
  std::allocator<distance>::allocator(&local_67);
  __l._M_len = local_58;
  __l._M_array = local_60;
  std::
  unordered_set<distance,_std::hash<distance>,_std::equal_to<distance>,_std::allocator<distance>_>::
  unordered_set((unordered_set<distance,_std::hash<distance>,_std::equal_to<distance>,_std::allocator<distance>_>
                 *)local_50,__l,0,&local_65,&local_66,&local_67);
  std::allocator<distance>::~allocator(&local_67);
  local_80[0]._M_cur =
       (__node_type *)
       std::
       unordered_set<distance,_std::hash<distance>,_std::equal_to<distance>,_std::allocator<distance>_>
       ::find((unordered_set<distance,_std::hash<distance>,_std::equal_to<distance>,_std::allocator<distance>_>
               *)local_50,local_c);
  d_00 = std::__detail::_Node_iterator<distance,_true,_false>::operator*
                   ((_Node_iterator<distance,_true,_false> *)local_80);
  poVar1 = operator<<((ostream *)&std::cout,d_00);
  std::operator<<(poVar1,'\n');
  std::
  unordered_set<distance,_std::hash<distance>,_std::equal_to<distance>,_std::allocator<distance>_>::
  ~unordered_set((unordered_set<distance,_std::hash<distance>,_std::equal_to<distance>,_std::allocator<distance>_>
                  *)local_50);
  return 0;
}

Assistant:

int main()
{
    distance d(4);
    //    int      val = d; // error
    //    d += 3;           // error
    d += distance(3); // works

    std::unordered_set<distance> set{d};

    std::cout << *set.find(d) << '\n';
}